

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexBank(void)

{
  char *badValueMessage;
  bool bVar1;
  int iVar2;
  char *nextLp;
  aint bankIndex;
  aint bankNum;
  
  if (nex.canAppend) {
    while ((badValueMessage = lp,
           iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)((long)&nextLp + 4)), iVar2 != 0 &&
           (nextLp._0_4_ = getNexBankIndex(nextLp._4_4_), -1 < (aint)nextLp))) {
      bVar1 = saveBank((aint)nextLp,nextLp._4_4_,false);
      if (!bVar1) {
        return;
      }
      bVar1 = comma(&lp);
      if (!bVar1) {
        return;
      }
    }
    Error("[SAVENEX] expected bank number 0..111",badValueMessage,SUPPRESS);
  }
  else {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
  }
  return;
}

Assistant:

static void dirNexBank() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	do {
		aint bankNum, bankIndex;
		char *nextLp = lp;
		if (!ParseExpressionNoSyntaxError(lp, bankNum)
			|| (bankIndex = getNexBankIndex(bankNum)) < 0) {
			Error("[SAVENEX] expected bank number 0..111", nextLp, SUPPRESS);
			break;
		}
		if (!saveBank(bankIndex, bankNum)) break;
	} while (comma(lp));
}